

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::WriteToShardStatusFileIfNeeded(void)

{
  char *__filename;
  FILE *__stream;
  
  __filename = getenv("GTEST_SHARD_STATUS_FILE");
  if (__filename == (char *)0x0) {
    return;
  }
  __stream = fopen(__filename,"w");
  if (__stream != (FILE *)0x0) {
    fclose(__stream);
    return;
  }
  ColoredPrintf(COLOR_RED,
                "Could not write to the test shard status file \"%s\" specified by the %s environment variable.\n"
                ,__filename,"GTEST_SHARD_STATUS_FILE");
  fflush(_stdout);
  exit(1);
}

Assistant:

const TestProperty& TestResult::GetTestProperty(int i) const {
  if (i < 0 || i >= test_property_count())
    internal::posix::Abort();
  return test_properties_.at(static_cast<size_t>(i));
}